

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# transform.cc
# Opt level: O1

void __thiscall
kratos::LiftGenVarInstanceVisitor::visit(LiftGenVarInstanceVisitor *this,Generator *top)

{
  __node_base_ptr *this_00;
  pointer psVar1;
  Context *this_01;
  Generator *generator;
  bool bVar2;
  vector<kratos::ModuleInstantiationStmt*,std::allocator<kratos::ModuleInstantiationStmt*>> *this_02
  ;
  UserException *this_03;
  pointer psVar3;
  long *plVar4;
  undefined1 local_a8 [8];
  unordered_map<unsigned_long,_std::vector<kratos::ModuleInstantiationStmt_*,_std::allocator<kratos::ModuleInstantiationStmt_*>_>,_std::hash<unsigned_long>,_std::equal_to<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_std::vector<kratos::ModuleInstantiationStmt_*,_std::allocator<kratos::ModuleInstantiationStmt_*>_>_>_>_>
  generator_map;
  uint64_t hash;
  __node_base local_60;
  undefined8 uStack_58;
  undefined4 local_50;
  undefined8 local_48;
  __node_base _Stack_40;
  ModuleInstantiationStmt *local_38;
  ModuleInstantiationStmt *inst;
  
  local_a8 = (undefined1  [8])&generator_map._M_h._M_rehash_policy._M_next_resize;
  generator_map._M_h._M_buckets = (__buckets_ptr)0x1;
  generator_map._M_h._M_bucket_count = 0;
  generator_map._M_h._M_before_begin._M_nxt = (_Hash_node_base *)0x0;
  generator_map._M_h._M_element_count._0_4_ = 0x3f800000;
  generator_map._M_h._M_rehash_policy._M_max_load_factor = 0.0;
  generator_map._M_h._M_rehash_policy._4_4_ = 0;
  generator_map._M_h._M_rehash_policy._M_next_resize = 0;
  psVar3 = (top->stmts_).
           super__Vector_base<std::shared_ptr<kratos::Stmt>,_std::allocator<std::shared_ptr<kratos::Stmt>_>_>
           ._M_impl.super__Vector_impl_data._M_start;
  psVar1 = (top->stmts_).
           super__Vector_base<std::shared_ptr<kratos::Stmt>,_std::allocator<std::shared_ptr<kratos::Stmt>_>_>
           ._M_impl.super__Vector_impl_data._M_finish;
  if (psVar3 != psVar1) {
    this_01 = top->context_;
    do {
      if (((psVar3->super___shared_ptr<kratos::Stmt,_(__gnu_cxx::_Lock_policy)2>)._M_ptr)->type_ ==
          ModuleInstantiation) {
        local_38 = (ModuleInstantiationStmt *)
                   (psVar3->super___shared_ptr<kratos::Stmt,_(__gnu_cxx::_Lock_policy)2>)._M_ptr;
        generator = local_38->target_;
        bVar2 = Context::has_hash(this_01,generator);
        if (!bVar2) {
          this_03 = (UserException *)__cxa_allocate_exception(0x10);
          generator_map._M_h._M_single_bucket = &local_60;
          std::__cxx11::string::_M_construct<char_const*>
                    ((string *)&generator_map._M_h._M_single_bucket,"Cannot find hash for generator"
                     ,"");
          UserException::UserException(this_03,(string *)&generator_map._M_h._M_single_bucket);
          __cxa_throw(this_03,&UserException::typeinfo,std::runtime_error::~runtime_error);
        }
        generator_map._M_h._M_single_bucket = (__node_base_ptr)Context::get_hash(this_01,generator);
        this_02 = (vector<kratos::ModuleInstantiationStmt*,std::allocator<kratos::ModuleInstantiationStmt*>>
                   *)std::__detail::
                     _Map_base<unsigned_long,_std::pair<const_unsigned_long,_std::vector<kratos::ModuleInstantiationStmt_*,_std::allocator<kratos::ModuleInstantiationStmt_*>_>_>,_std::allocator<std::pair<const_unsigned_long,_std::vector<kratos::ModuleInstantiationStmt_*,_std::allocator<kratos::ModuleInstantiationStmt_*>_>_>_>,_std::__detail::_Select1st,_std::equal_to<unsigned_long>,_std::hash<unsigned_long>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>,_true>
                     ::operator[]((_Map_base<unsigned_long,_std::pair<const_unsigned_long,_std::vector<kratos::ModuleInstantiationStmt_*,_std::allocator<kratos::ModuleInstantiationStmt_*>_>_>,_std::allocator<std::pair<const_unsigned_long,_std::vector<kratos::ModuleInstantiationStmt_*,_std::allocator<kratos::ModuleInstantiationStmt_*>_>_>_>,_std::__detail::_Select1st,_std::equal_to<unsigned_long>,_std::hash<unsigned_long>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>,_true>
                                   *)local_a8,(key_type *)&generator_map._M_h._M_single_bucket);
        std::
        vector<kratos::ModuleInstantiationStmt*,std::allocator<kratos::ModuleInstantiationStmt*>>::
        emplace_back<kratos::ModuleInstantiationStmt*&>(this_02,&local_38);
      }
      psVar3 = psVar3 + 1;
    } while (psVar3 != psVar1);
  }
  if (generator_map._M_h._M_bucket_count != 0) {
    this_00 = &generator_map._M_h._M_single_bucket;
    plVar4 = (long *)generator_map._M_h._M_bucket_count;
    do {
      if (8 < (ulong)(plVar4[3] - plVar4[2])) {
        local_60._M_nxt = (_Hash_node_base *)0x0;
        uStack_58 = 0;
        local_50 = 0x3f800000;
        local_48 = 0;
        _Stack_40._M_nxt = (_Hash_node_base *)0x0;
        generator_map._M_h._M_single_bucket = &_Stack_40;
        bVar2 = check_child_instance
                          ((vector<kratos::ModuleInstantiationStmt_*,_std::allocator<kratos::ModuleInstantiationStmt_*>_>
                            *)(plVar4 + 2),
                           (unordered_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::unordered_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::unordered_set<unsigned_long,_std::hash<unsigned_long>,_std::equal_to<unsigned_long>,_std::allocator<unsigned_long>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::unordered_set<unsigned_long,_std::hash<unsigned_long>,_std::equal_to<unsigned_long>,_std::allocator<unsigned_long>_>_>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::unordered_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::unordered_set<unsigned_long,_std::hash<unsigned_long>,_std::equal_to<unsigned_long>,_std::allocator<unsigned_long>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::unordered_set<unsigned_long,_std::hash<unsigned_long>,_std::equal_to<unsigned_long>,_std::allocator<unsigned_long>_>_>_>_>_>_>_>
                            *)this_00);
        if (bVar2) {
          create_gen_var_instance
                    ((vector<kratos::ModuleInstantiationStmt_*,_std::allocator<kratos::ModuleInstantiationStmt_*>_>
                      *)(plVar4 + 2),
                     (unordered_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::unordered_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::unordered_set<unsigned_long,_std::hash<unsigned_long>,_std::equal_to<unsigned_long>,_std::allocator<unsigned_long>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::unordered_set<unsigned_long,_std::hash<unsigned_long>,_std::equal_to<unsigned_long>,_std::allocator<unsigned_long>_>_>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::unordered_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::unordered_set<unsigned_long,_std::hash<unsigned_long>,_std::equal_to<unsigned_long>,_std::allocator<unsigned_long>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::unordered_set<unsigned_long,_std::hash<unsigned_long>,_std::equal_to<unsigned_long>,_std::allocator<unsigned_long>_>_>_>_>_>_>_>
                      *)this_00);
        }
        std::
        _Hashtable<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::unordered_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::unordered_set<unsigned_long,_std::hash<unsigned_long>,_std::equal_to<unsigned_long>,_std::allocator<unsigned_long>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::unordered_set<unsigned_long,_std::hash<unsigned_long>,_std::equal_to<unsigned_long>,_std::allocator<unsigned_long>_>_>_>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::unordered_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::unordered_set<unsigned_long,_std::hash<unsigned_long>,_std::equal_to<unsigned_long>,_std::allocator<unsigned_long>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::unordered_set<unsigned_long,_std::hash<unsigned_long>,_std::equal_to<unsigned_long>,_std::allocator<unsigned_long>_>_>_>_>_>_>,_std::__detail::_Select1st,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>_>
        ::~_Hashtable((_Hashtable<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::unordered_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::unordered_set<unsigned_long,_std::hash<unsigned_long>,_std::equal_to<unsigned_long>,_std::allocator<unsigned_long>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::unordered_set<unsigned_long,_std::hash<unsigned_long>,_std::equal_to<unsigned_long>,_std::allocator<unsigned_long>_>_>_>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::unordered_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::unordered_set<unsigned_long,_std::hash<unsigned_long>,_std::equal_to<unsigned_long>,_std::allocator<unsigned_long>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::unordered_set<unsigned_long,_std::hash<unsigned_long>,_std::equal_to<unsigned_long>,_std::allocator<unsigned_long>_>_>_>_>_>_>,_std::__detail::_Select1st,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>_>
                       *)this_00);
      }
      plVar4 = (long *)*plVar4;
    } while (plVar4 != (long *)0x0);
  }
  std::
  _Hashtable<unsigned_long,_std::pair<const_unsigned_long,_std::vector<kratos::ModuleInstantiationStmt_*,_std::allocator<kratos::ModuleInstantiationStmt_*>_>_>,_std::allocator<std::pair<const_unsigned_long,_std::vector<kratos::ModuleInstantiationStmt_*,_std::allocator<kratos::ModuleInstantiationStmt_*>_>_>_>,_std::__detail::_Select1st,_std::equal_to<unsigned_long>,_std::hash<unsigned_long>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>_>
  ::~_Hashtable((_Hashtable<unsigned_long,_std::pair<const_unsigned_long,_std::vector<kratos::ModuleInstantiationStmt_*,_std::allocator<kratos::ModuleInstantiationStmt_*>_>_>,_std::allocator<std::pair<const_unsigned_long,_std::vector<kratos::ModuleInstantiationStmt_*,_std::allocator<kratos::ModuleInstantiationStmt_*>_>_>_>,_std::__detail::_Select1st,_std::equal_to<unsigned_long>,_std::hash<unsigned_long>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>_>
                 *)local_a8);
  return;
}

Assistant:

void visit(Generator* top) override {
        // we are only interested in generator instances that shares the same name
        // and has the same hash
        std::unordered_map<uint64_t, std::vector<ModuleInstantiationStmt*>> generator_map;
        // we use the hash value. I'm pretty sure that this won't catch all the corner cases
        // but it's good enough for now
        auto const* context = top->context();
        // we assume the module instantiation is done
        for (auto const& stmt : top->get_all_stmts()) {
            if (stmt->type() == StatementType::ModuleInstantiation) {
                auto* inst = reinterpret_cast<ModuleInstantiationStmt*>(stmt.get());
                auto const* gen = inst->target();

                if (!context->has_hash(gen)) {
                    throw UserException("Cannot find hash for generator");
                }
                auto hash = context->get_hash(gen);
                generator_map[hash].emplace_back(inst);
            }
        }

        // only interested in entries that has more than 1 entries
        for (auto const& [hash, generators] : generator_map) {
            if (generators.size() <= 1) continue;
            std::unordered_map<std::string, PortInfo> port_mapping;
            bool check = check_child_instance(generators, port_mapping);
            if (check) {
                // change it to a loop structure
                create_gen_var_instance(generators, port_mapping);
            }
        }
    }